

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O0

void __thiscall
EmitNoXml::tagField(EmitNoXml *this,char *ptr,syntax_highlight hl,Datatype *ct,int4 off)

{
  int4 off_local;
  Datatype *ct_local;
  syntax_highlight hl_local;
  char *ptr_local;
  EmitNoXml *this_local;
  
  std::operator<<((this->super_EmitXml).s,ptr);
  return;
}

Assistant:

virtual void tagField(const char *ptr,syntax_highlight hl,const Datatype *ct,int4 off) {
    *s << ptr; }